

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_ClearInitToOrig(Abc_Obj_t *pInit)

{
  int iVar1;
  MinRegMan_t *pMVar2;
  NodeLag_t *pNVar3;
  int iVar4;
  int iVar5;
  
  pMVar2 = pManMR;
  iVar5 = (int)pInit;
  iVar1 = pManMR->sizeInitToOrig;
  if (iVar5 < iVar1) {
    pNVar3 = pManMR->pInitToOrig;
  }
  else {
    iVar4 = (int)((double)iVar5 * 1.5 + 10.0);
    pManMR->sizeInitToOrig = iVar4;
    pNVar3 = (NodeLag_t *)realloc(pMVar2->pInitToOrig,(long)iVar4 << 3);
    pMVar2 = pManMR;
    pManMR->pInitToOrig = pNVar3;
    memset(pNVar3 + iVar1,0,((long)pMVar2->sizeInitToOrig - (long)iVar1) * 8);
  }
  if (pNVar3 != (NodeLag_t *)0x0) {
    pNVar3[iVar5].id = -1;
    return;
  }
  __assert_fail("pManMR->pInitToOrig",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0x4f4,"void Abc_FlowRetime_ClearInitToOrig(Abc_Obj_t *)");
}

Assistant:

void Abc_FlowRetime_ClearInitToOrig( Abc_Obj_t *pInit )
{
  int id = Abc_ObjId( pInit );
  
  // grow data structure if necessary
  if (id >= pManMR->sizeInitToOrig) {
    int oldSize = pManMR->sizeInitToOrig;
    pManMR->sizeInitToOrig = 1.5*id + 10;
    pManMR->pInitToOrig = (NodeLag_t*)realloc(pManMR->pInitToOrig, sizeof(NodeLag_t)*pManMR->sizeInitToOrig);
    memset( &(pManMR->pInitToOrig[oldSize]), 0, sizeof(NodeLag_t)*(pManMR->sizeInitToOrig-oldSize) );
  }
  assert( pManMR->pInitToOrig );

  pManMR->pInitToOrig[id].id = -1;
}